

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O1

FactoryPair * __thiscall
Assimp::Blender::DNA::GetBlobToStructureConverter
          (FactoryPair *__return_storage_ptr__,DNA *this,Structure *structure,FileDatabase *param_2)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  _Rb_tree_color _Var3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  cVar2 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>_>
                  *)this,&structure->name);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->converters)._M_t._M_impl.super__Rb_tree_header) {
    _Var3 = _S_red;
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    __return_storage_ptr__->second = 0;
    *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
  }
  else {
    _Var3 = cVar2._M_node[2]._M_color;
    uVar4 = *(undefined4 *)&cVar2._M_node[2].field_0x4;
    uVar5 = *(undefined4 *)&cVar2._M_node[2]._M_parent;
    uVar6 = *(undefined4 *)((long)&cVar2._M_node[2]._M_parent + 4);
    p_Var1 = cVar2._M_node[2]._M_right;
    __return_storage_ptr__->second = (offset_in_Structure_to_subr)cVar2._M_node[2]._M_left;
    *(_Base_ptr *)&__return_storage_ptr__->field_0x18 = p_Var1;
  }
  *(_Rb_tree_color *)&__return_storage_ptr__->first = _Var3;
  *(undefined4 *)((long)&__return_storage_ptr__->first + 4) = uVar4;
  *(undefined4 *)&__return_storage_ptr__->field_0x8 = uVar5;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = uVar6;
  return __return_storage_ptr__;
}

Assistant:

DNA::FactoryPair DNA :: GetBlobToStructureConverter(
    const Structure& structure,
    const FileDatabase& /*db*/
) const
{
    std::map<std::string,  FactoryPair>::const_iterator it = converters.find(structure.name);
    return it == converters.end() ? FactoryPair() : (*it).second;
}